

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O0

BOOL MiscPutenv(char *string,BOOL deleteIfEmpty)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CPalThread *pThread;
  char *pcVar4;
  size_t sVar5;
  char **local_58;
  char **newEnviron;
  CPalThread *pthrCurrent;
  BOOL result;
  int iStack_38;
  bool fOwningCS;
  int j;
  int i;
  int length;
  char *copy;
  char *existingEquals;
  char *equals;
  BOOL deleteIfEmpty_local;
  char *string_local;
  
  _i = (char *)0x0;
  bVar1 = false;
  pthrCurrent._4_4_ = 0;
  pThread = CorUnix::InternalGetCurrentThread();
  pcVar4 = strchr(string,0x3d);
  if ((pcVar4 != string) && (pcVar4 != (char *)0x0)) {
    if ((pcVar4[1] == '\0') && (deleteIfEmpty != 0)) {
      sVar5 = strlen(string);
      iVar2 = (int)sVar5;
      _i = (char *)CorUnix::InternalMalloc((long)iVar2);
      if (_i != (char *)0x0) {
        memcpy(_i,string,(long)(iVar2 + -1));
        _i[iVar2 + -1] = '\0';
        MiscUnsetenv(_i);
        pthrCurrent._4_4_ = 1;
      }
    }
    else {
      _i = CorUnix::InternalStrdup(string);
      if (_i != (char *)0x0) {
        iVar2 = (int)pcVar4 - (int)string;
        CorUnix::InternalEnterCriticalSection(pThread,&gcsEnvironment);
        bVar1 = true;
        for (iStack_38 = 0; palEnvironment[iStack_38] != (char *)0x0; iStack_38 = iStack_38 + 1) {
          copy = strchr(palEnvironment[iStack_38],0x3d);
          if (copy == (char *)0x0) {
            pcVar4 = palEnvironment[iStack_38];
            sVar5 = strlen(palEnvironment[iStack_38]);
            copy = pcVar4 + sVar5;
          }
          if (((long)copy - (long)palEnvironment[iStack_38] == (long)iVar2) &&
             (iVar3 = memcmp(string,palEnvironment[iStack_38],(long)iVar2), iVar3 == 0)) {
            palEnvironment[iStack_38] = _i;
            _i = (char *)0x0;
            pthrCurrent._4_4_ = 1;
            break;
          }
        }
        if (palEnvironment[iStack_38] == (char *)0x0) {
          if (MiscPutenv::sAllocatedEnviron == 0) {
            local_58 = (char **)CorUnix::InternalMalloc((long)(iStack_38 + 2) << 3);
            if (local_58 == (char **)0x0) goto LAB_00127fa6;
            for (result = 0; palEnvironment[result] != (char *)0x0; result = result + 1) {
              local_58[result] = palEnvironment[result];
            }
            MiscPutenv::sAllocatedEnviron = 1;
          }
          else {
            local_58 = (char **)CorUnix::InternalRealloc(palEnvironment,(long)(iStack_38 + 2) << 3);
            if (local_58 == (char **)0x0) goto LAB_00127fa6;
          }
          palEnvironment = local_58;
          MiscSetEnvArray();
          palEnvironment[iStack_38] = _i;
          palEnvironment[iStack_38 + 1] = (char *)0x0;
          _i = (char *)0x0;
          pthrCurrent._4_4_ = 1;
        }
      }
    }
  }
LAB_00127fa6:
  if (bVar1) {
    CorUnix::InternalLeaveCriticalSection(pThread,&gcsEnvironment);
  }
  if (_i != (char *)0x0) {
    CorUnix::InternalFree(_i);
  }
  return pthrCurrent._4_4_;
}

Assistant:

BOOL MiscPutenv(const char *string, BOOL deleteIfEmpty)
{
    const char *equals, *existingEquals;
    char *copy = NULL;
    int length;
    int i, j;
    bool fOwningCS = false;
    BOOL result = FALSE;
    CPalThread * pthrCurrent = InternalGetCurrentThread();

    equals = strchr(string, '=');
    if (equals == string || equals == NULL)
    {
        // "=foo" and "foo" have no meaning
        goto done;
    }
    if (equals[1] == '\0' && deleteIfEmpty)
    {
        // "foo=" removes foo from the environment in _putenv() on Windows.
        // The same string can result from a call to SetEnvironmentVariable()
        // with the empty string as the value, but in that case we want to
        // set the variable's value to "". deleteIfEmpty will be FALSE in
        // that case.
        length = strlen(string);
        copy = (char *) InternalMalloc(length);
        if (copy == NULL)
        {
            goto done;
        }
        memcpy(copy, string, length - 1);
        copy[length - 1] = '\0';    // Change '=' to '\0'
        MiscUnsetenv(copy);
        result = TRUE;
    }
    else
    {
        // See if we are replacing an item or adding one.

        // Make our copy up front, since we'll use it either way.
        copy = InternalStrdup(string);
        if (copy == NULL)
        {
            goto done;
        }

        length = equals - string;

        InternalEnterCriticalSection(pthrCurrent, &gcsEnvironment);
        fOwningCS = true;

        for(i = 0; palEnvironment[i] != NULL; i++)
        {
            existingEquals = strchr(palEnvironment[i], '=');
            if (existingEquals == NULL)
            {
                // The PAL screens out malformed strings, but
                // environ comes from the system, so it might
                // have strings without '='. We treat the entire
                // string as a name in that case.
                existingEquals = palEnvironment[i] + strlen(palEnvironment[i]);
            }
            if (existingEquals - palEnvironment[i] == length)
            {
                if (memcmp(string, palEnvironment[i], length) == 0)
                {
                    // Replace this one. Don't free the original,
                    // though, because there may be outstanding
                    // references to it that were acquired via
                    // getenv. This is an unavoidable memory leak.
                    palEnvironment[i] = copy;

                    // Set 'copy' to NULL so it won't be freed
                    copy = NULL;

                    result = TRUE;
                    break;
                }
            }
        }
        if (palEnvironment[i] == NULL)
        {
            static BOOL sAllocatedEnviron = FALSE;
            // Add a new environment variable.
            // We'd like to realloc palEnvironment, but we can't do that the
            // first time through.
            char **newEnviron = NULL;

            if (sAllocatedEnviron) {
                if (NULL == (newEnviron =
                        (char **)InternalRealloc(palEnvironment, (i + 2) * sizeof(char *))))
                {
                    goto done;
                }
            }
            else
            {
                // Allocate palEnvironment ourselves so we can realloc it later.
                newEnviron = (char **)InternalMalloc((i + 2) * sizeof(char *));
                if (newEnviron == NULL)
                {
                    goto done;
                }
                for(j = 0; palEnvironment[j] != NULL; j++)
                {
                    newEnviron[j] = palEnvironment[j];
                }
                sAllocatedEnviron = TRUE;
            }
            palEnvironment = newEnviron;
            MiscSetEnvArray();
            palEnvironment[i] = copy;
            palEnvironment[i + 1] = NULL;

            // Set 'copy' to NULL so it won't be freed
            copy = NULL;

            result = TRUE;
        }
    }
done:

    if (fOwningCS)
    {
        InternalLeaveCriticalSection(pthrCurrent, &gcsEnvironment);
    }
    if (NULL != copy)
    {
        InternalFree(copy);
    }
    return result;
}